

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

Error asmjit::Logging::formatLine
                (StringBuilder *sb,uint8_t *binData,size_t binLen,size_t dispLen,size_t imLen,
                char *comment)

{
  Error EVar1;
  char c;
  size_t i;
  size_t len;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  
  len = 0;
  if (comment != (char *)0x0) {
    for (; len != 0x200; len = len + 1) {
      if (comment[len] == '\0') goto LAB_001106f0;
    }
    len = 0x200;
  }
LAB_001106f0:
  if (binLen < dispLen) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/base/logging.cpp"
               ,0x1c4,"binLen >= dispLen");
  }
  if (binLen - 1 < 0xfffffffffffffffe || len != 0) {
    sVar2 = sb->_length;
    c = ';';
    sVar5 = sVar2;
    for (uVar3 = 0x28; lVar4 = (ulong)(binLen == 0xffffffffffffffff) * 0x1a + uVar3, lVar4 != 0x5c;
        uVar3 = uVar3 + 0x1a) {
      if ((((sVar5 < uVar3) && (EVar1 = StringBuilder::_opChars(sb,1,' ',uVar3 - sVar5), EVar1 != 0)
           ) || (EVar1 = StringBuilder::_opChar(sb,1,c), EVar1 != 0)) ||
         (EVar1 = StringBuilder::_opChar(sb,1,' '), EVar1 != 0)) {
        return EVar1;
      }
      if (lVar4 == 0x28) {
        EVar1 = StringBuilder::_opHex(sb,1,binData,binLen - (dispLen + imLen));
        if (EVar1 != 0) {
          return EVar1;
        }
        EVar1 = StringBuilder::_opChars(sb,1,'.',dispLen * 2);
        if (EVar1 != 0) {
          return EVar1;
        }
        EVar1 = StringBuilder::_opHex(sb,1,binData + (binLen - imLen),imLen);
        if (EVar1 != 0) {
          return EVar1;
        }
        if (len == 0) break;
      }
      else {
        EVar1 = StringBuilder::_opString(sb,1,comment,len);
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      lVar4 = sVar5 - sVar2;
      sVar2 = sb->_length;
      sVar5 = lVar4 + sVar2;
      c = '|';
    }
  }
  EVar1 = StringBuilder::_opChar(sb,1,'\n');
  return EVar1;
}

Assistant:

Error Logging::formatLine(StringBuilder& sb, const uint8_t* binData, size_t binLen, size_t dispLen, size_t imLen, const char* comment) noexcept {
  size_t currentLen = sb.getLength();
  size_t commentLen = comment ? Utils::strLen(comment, kMaxCommentLength) : 0;

  ASMJIT_ASSERT(binLen >= dispLen);

  if ((binLen != 0 && binLen != Globals::kInvalidIndex) || commentLen) {
    size_t align = kMaxInstLength;
    char sep = ';';

    for (size_t i = (binLen == Globals::kInvalidIndex); i < 2; i++) {
      size_t begin = sb.getLength();

      // Append align.
      if (currentLen < align)
        ASMJIT_PROPAGATE(sb.appendChars(' ', align - currentLen));

      // Append separator.
      if (sep) {
        ASMJIT_PROPAGATE(sb.appendChar(sep));
        ASMJIT_PROPAGATE(sb.appendChar(' '));
      }

      // Append binary data or comment.
      if (i == 0) {
        ASMJIT_PROPAGATE(sb.appendHex(binData, binLen - dispLen - imLen));
        ASMJIT_PROPAGATE(sb.appendChars('.', dispLen * 2));
        ASMJIT_PROPAGATE(sb.appendHex(binData + binLen - imLen, imLen));
        if (commentLen == 0) break;
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString(comment, commentLen));
      }

      currentLen += sb.getLength() - begin;
      align += kMaxBinaryLength;
      sep = '|';
    }
  }

  return sb.appendChar('\n');
}